

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError IsFormatSupported(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *inputParameters,
                         PaStreamParameters *outputParameters,double sampleRate)

{
  PaUtilHostApiRepresentation *in_RDX;
  PaStreamParameters *in_RSI;
  PaUtilHostApiRepresentation *in_RDI;
  double in_XMM0_Qa;
  PaError result;
  PaSampleFormat outputSampleFormat;
  PaSampleFormat inputSampleFormat;
  int outputChannelCount;
  int inputChannelCount;
  PaError local_44;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  local_30 = 0;
  if (in_RSI != (PaStreamParameters *)0x0) {
    paUtilErr_ = ValidateParameters(in_RSI,in_RDX,(StreamDirection)((ulong)in_XMM0_Qa >> 0x20));
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'ValidateParameters( inputParameters, hostApi, StreamDirection_In )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1837\n"
                       );
      return paUtilErr_;
    }
    local_2c = in_RSI->channelCount;
  }
  if (in_RDX != (PaUtilHostApiRepresentation *)0x0) {
    paUtilErr_ = ValidateParameters(in_RSI,in_RDX,(StreamDirection)((ulong)in_XMM0_Qa >> 0x20));
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'ValidateParameters( outputParameters, hostApi, StreamDirection_Out )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1845\n"
                       );
      return paUtilErr_;
    }
    local_30 = *(int *)((long)&(in_RDX->privatePaFrontInfo).baseDeviceIndex + 4);
  }
  if (((local_2c == 0) ||
      (local_44 = TestParameters(in_RDI,in_RSI,in_XMM0_Qa,StreamDirection_In), local_44 == 0)) &&
     ((local_30 == 0 ||
      (local_44 = TestParameters(in_RDI,(PaStreamParameters *)in_RDX,in_XMM0_Qa,StreamDirection_Out)
      , local_44 == 0)))) {
    return 0;
  }
  return local_44;
}

Assistant:

static PaError IsFormatSupported( struct PaUtilHostApiRepresentation *hostApi,
                                  const PaStreamParameters *inputParameters,
                                  const PaStreamParameters *outputParameters,
                                  double sampleRate )
{
    int inputChannelCount = 0, outputChannelCount = 0;
    PaSampleFormat inputSampleFormat, outputSampleFormat;
    PaError result = paFormatIsSupported;

    if( inputParameters )
    {
        PA_ENSURE( ValidateParameters( inputParameters, hostApi, StreamDirection_In ) );

        inputChannelCount = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;
    }

    if( outputParameters )
    {
        PA_ENSURE( ValidateParameters( outputParameters, hostApi, StreamDirection_Out ) );

        outputChannelCount = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
    }

    if( inputChannelCount )
    {
        if( ( result = TestParameters( hostApi, inputParameters, sampleRate, StreamDirection_In ) )
                != paNoError )
            goto error;
    }
    if ( outputChannelCount )
    {
        if( ( result = TestParameters( hostApi, outputParameters, sampleRate, StreamDirection_Out ) )
                != paNoError )
            goto error;
    }

    return paFormatIsSupported;

error:
    return result;
}